

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTSoundBank_GetState(FACTSoundBank *pSoundBank,uint32_t *pdwState)

{
  uint *in_RSI;
  long in_RDI;
  uint16_t i;
  ushort local_1a;
  uint32_t local_4;
  
  if (in_RDI == 0) {
    *in_RSI = 0;
    local_4 = 1;
  }
  else {
    FAudio_PlatformLockMutex((FAudioMutex)0x114e22);
    *in_RSI = 4;
    for (local_1a = 0; local_1a < *(ushort *)(in_RDI + 0x20); local_1a = local_1a + 1) {
      if (*(char *)(*(long *)(in_RDI + 0x48) + (ulong)local_1a * 0x14 + 0x13) != '\0') {
        *in_RSI = *in_RSI | 0x80;
        FAudio_PlatformUnlockMutex((FAudioMutex)0x114e87);
        return 0;
      }
    }
    FAudio_PlatformUnlockMutex((FAudioMutex)0x114eb6);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32_t FACTSoundBank_GetState(
	FACTSoundBank *pSoundBank,
	uint32_t *pdwState
) {
	uint16_t i;
	if (pSoundBank == NULL)
	{
		*pdwState = 0;
		return 1;
	}

	FAudio_PlatformLockMutex(pSoundBank->parentEngine->apiLock);

	*pdwState = FACT_STATE_PREPARED;
	for (i = 0; i < pSoundBank->cueCount; i += 1)
	{
		if (pSoundBank->cues[i].instanceCount > 0)
		{
			*pdwState |= FACT_STATE_INUSE;
			FAudio_PlatformUnlockMutex(
				pSoundBank->parentEngine->apiLock
			);
			return 0;
		}
	}

	FAudio_PlatformUnlockMutex(pSoundBank->parentEngine->apiLock);
	return 0;
}